

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O2

AWeapon * __thiscall FWeaponSlots::PickNextWeapon(FWeaponSlots *this,player_t *player)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  AWeapon *this_00;
  uint uVar4;
  uint uVar5;
  PClassWeapon *type;
  int iVar6;
  int startindex;
  int startslot;
  uint local_3c;
  FWeaponSlots *local_38;
  
  if (player->mo == (APlayerPawn *)0x0) {
    return (AWeapon *)0x0;
  }
  if (player->ReadyWeapon == (AWeapon *)0x0) {
LAB_004a3163:
    startslot = 9;
    startindex = this->Slots[9].Weapons.Count - 1;
  }
  else {
    bVar2 = FindMostRecentWeapon(player,&startslot,&startindex);
    if (!bVar2) goto LAB_004a324b;
    if (player->ReadyWeapon == (AWeapon *)0x0) goto LAB_004a3163;
  }
  local_3c = 0;
  uVar5 = startindex;
  local_38 = this;
  iVar3 = startslot;
  do {
    while( true ) {
      uVar4 = uVar5 + 1;
      iVar6 = iVar3 + 1;
      if (8 < iVar3) {
        iVar6 = 0;
      }
      uVar1 = local_38->Slots[iVar3].Weapons.Count;
      uVar5 = 0;
      if ((int)uVar4 < (int)uVar1) {
        uVar5 = uVar4;
        iVar6 = iVar3;
      }
      if (uVar5 < local_38->Slots[iVar6].Weapons.Count) {
        type = local_38->Slots[iVar6].Weapons.Array[(int)uVar5].Type;
      }
      else {
        type = (PClassWeapon *)0x0;
      }
      this_00 = (AWeapon *)
                AActor::FindInventory(&player->mo->super_AActor,(PClassActor *)type,false);
      if ((this_00 != (AWeapon *)0x0) &&
         (bVar2 = AWeapon::CheckAmmo(this_00,2,false,false,-1), bVar2)) {
        return this_00;
      }
      local_3c = local_3c + ((int)uVar1 <= (int)uVar4);
      iVar3 = iVar6;
      if (iVar6 != startslot) break;
      if ((uVar5 == startindex) || (10 < local_3c)) goto LAB_004a324b;
    }
  } while (local_3c < 0xb);
LAB_004a324b:
  return player->ReadyWeapon;
}

Assistant:

AWeapon *FWeaponSlots::PickNextWeapon(player_t *player)
{
	int startslot, startindex;
	int slotschecked = 0;

	if (player->mo == NULL)
	{
		return NULL;
	}
	if (player->ReadyWeapon == NULL || FindMostRecentWeapon(player, &startslot, &startindex))
	{
		int slot;
		int index;

		if (player->ReadyWeapon == NULL)
		{
			startslot = NUM_WEAPON_SLOTS - 1;
			startindex = Slots[startslot].Size() - 1;
		}

		slot = startslot;
		index = startindex;
		do
		{
			if (++index >= Slots[slot].Size())
			{
				index = 0;
				slotschecked++;
				if (++slot >= NUM_WEAPON_SLOTS)
				{
					slot = 0;
				}
			}
			PClassWeapon *type = Slots[slot].GetWeapon(index);
			AWeapon *weap = static_cast<AWeapon *>(player->mo->FindInventory(type));
			if (weap != NULL && weap->CheckAmmo(AWeapon::EitherFire, false))
			{
				return weap;
			}
		}
		while ((slot != startslot || index != startindex) && slotschecked <= NUM_WEAPON_SLOTS);
	}
	return player->ReadyWeapon;
}